

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOptBailOut.cpp
# Opt level: O0

void __thiscall GlobOpt::TrackCalls(GlobOpt *this,Instr *instr)

{
  OpCode OVar1;
  uint uVar2;
  Instr *this_00;
  Instr *pIVar3;
  code *pcVar4;
  IRType IVar5;
  bool bVar6;
  bool bVar7;
  uint32 uVar8;
  uint32 uVar9;
  uint uVar10;
  RegOpnd *pRVar11;
  JitArenaAllocator *pJVar12;
  SListBase<IR::Opnd_*,_Memory::ArenaAllocator,_RealCount> *pSVar13;
  InlineeFrameInfo *pIVar14;
  Sym *pSVar15;
  GlobOptBlockData *pGVar16;
  BVSparse<Memory::JitArenaAllocator> *pBVar17;
  Opnd *pOVar18;
  SymOpnd *pSVar19;
  StackSym *this_01;
  Func *pFVar20;
  ByteCodeUsesInstr *this_02;
  undefined4 *puVar21;
  Value *local_138;
  uint local_12c;
  Instr *instrToMove;
  Instr *insertByteCodeUsesAfterInstr;
  Instr *tmpInstr;
  Instr *insertBeforeInstr;
  Instr *byteCodeUsesInstr;
  Instr *inlineBuiltInStartInstr;
  Func *currentFunc_1;
  StackSym *stackSym_1;
  InlineeFrameInfo *inlineeFrameInfo;
  Func *currentFunc;
  Opnd *pOStack_78;
  uint size;
  StackSym *local_70;
  StackSym *stackSym;
  Opnd *opnd;
  Opnd *local_58;
  code *local_50;
  undefined8 local_48;
  TrackAllocData local_40;
  Instr *local_18;
  Instr *instr_local;
  GlobOpt *this_local;
  
  OVar1 = instr->m_opcode;
  local_18 = instr;
  instr_local = (Instr *)this;
  if (OVar1 == StartCall) {
    if ((*(uint *)&this->field_0xf4 & 1) != 0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar21 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar21 = 1;
      bVar7 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptBailOut.cpp"
                         ,0x20a,"(!this->isCallHelper)","!this->isCallHelper");
      if (!bVar7) {
        pcVar4 = (code *)invalidInstructionException();
        (*pcVar4)();
      }
      puVar21 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar21 = 0;
    }
    pOVar18 = IR::Instr::GetDst(local_18);
    bVar7 = IR::Opnd::IsRegOpnd(pOVar18);
    if (!bVar7) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar21 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar21 = 1;
      bVar7 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptBailOut.cpp"
                         ,0x20b,"(instr->GetDst()->IsRegOpnd())","instr->GetDst()->IsRegOpnd()");
      if (!bVar7) {
        pcVar4 = (code *)invalidInstructionException();
        (*pcVar4)();
      }
      puVar21 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar21 = 0;
    }
    pOVar18 = IR::Instr::GetDst(local_18);
    pRVar11 = IR::Opnd::AsRegOpnd(pOVar18);
    if ((*(uint *)&pRVar11->m_sym->field_0x18 & 1) == 0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar21 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar21 = 1;
      bVar7 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptBailOut.cpp"
                         ,0x20c,"(instr->GetDst()->AsRegOpnd()->m_sym->m_isSingleDef)",
                         "instr->GetDst()->AsRegOpnd()->m_sym->m_isSingleDef");
      if (!bVar7) {
        pcVar4 = (code *)invalidInstructionException();
        (*pcVar4)();
      }
      puVar21 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar21 = 0;
    }
    if ((this->currentBlock->globOptData).callSequence ==
        (SListBase<IR::Opnd_*,_Memory::ArenaAllocator,_RealCount> *)0x0) {
      pJVar12 = this->alloc;
      Memory::TrackAllocData::CreateTrackAllocData
                (&local_40,
                 (type_info *)&SListBase<IR::Opnd*,Memory::ArenaAllocator,RealCount>::typeinfo,0,
                 0xffffffffffffffff,
                 "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptBailOut.cpp"
                 ,0x210);
      pJVar12 = (JitArenaAllocator *)
                Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
                TrackAllocInfo((ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *
                               )pJVar12,&local_40);
      local_50 = Memory::JitArenaAllocator::Alloc;
      local_48 = 0;
      pSVar13 = (SListBase<IR::Opnd_*,_Memory::ArenaAllocator,_RealCount> *)
                new<Memory::JitArenaAllocator>(0x10,pJVar12,0x4e98c0);
      SListBase<IR::Opnd_*,_Memory::ArenaAllocator,_RealCount>::SListBase(pSVar13);
      (this->currentBlock->globOptData).callSequence = pSVar13;
    }
    pSVar13 = (this->currentBlock->globOptData).callSequence;
    pJVar12 = this->alloc;
    local_58 = IR::Instr::GetDst(local_18);
    SListBase<IR::Opnd_*,_Memory::ArenaAllocator,_RealCount>::Prepend
              (pSVar13,&pJVar12->super_ArenaAllocator,&local_58);
    uVar10 = IR::Instr::GetArgOutCount(local_18,true);
    (this->currentBlock->globOptData).totalOutParamCount =
         uVar10 + (this->currentBlock->globOptData).totalOutParamCount;
    (this->currentBlock->globOptData).startCallCount =
         (this->currentBlock->globOptData).startCallCount + 1;
    return;
  }
  if (OVar1 == ArgOut_A) {
LAB_005e6980:
    stackSym = (StackSym *)IR::Instr::GetDst(instr);
    bVar7 = IR::Opnd::IsSymOpnd((Opnd *)stackSym);
    if (bVar7) {
      if ((*(uint *)&this->field_0xf4 & 1) != 0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar21 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar21 = 1;
        bVar7 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptBailOut.cpp"
                           ,0x229,"(!this->isCallHelper)","!this->isCallHelper");
        if (!bVar7) {
          pcVar4 = (code *)invalidInstructionException();
          (*pcVar4)();
        }
        puVar21 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar21 = 0;
      }
      bVar7 = SListBase<IR::Opnd_*,_Memory::ArenaAllocator,_RealCount>::Empty
                        ((this->currentBlock->globOptData).callSequence);
      if (bVar7) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar21 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar21 = 1;
        bVar7 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptBailOut.cpp"
                           ,0x22a,"(!this->currentBlock->globOptData.callSequence->Empty())",
                           "!this->currentBlock->globOptData.callSequence->Empty()");
        if (!bVar7) {
          pcVar4 = (code *)invalidInstructionException();
          (*pcVar4)();
        }
        puVar21 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar21 = 0;
      }
      pSVar19 = IR::Opnd::AsSymOpnd((Opnd *)stackSym);
      local_70 = Sym::AsStackSym(pSVar19->m_sym);
      if (((*(uint *)&local_70->field_0x18 >> 0x19 & 1) == 0) &&
         (local_18->m_opcode != ArgOut_A_FixupForStackArgs)) {
        pSVar13 = (this->currentBlock->globOptData).callSequence;
        pJVar12 = this->alloc;
        pOStack_78 = IR::Instr::GetDst(local_18);
        SListBase<IR::Opnd_*,_Memory::ArenaAllocator,_RealCount>::Prepend
                  (pSVar13,&pJVar12->super_ArenaAllocator,&stack0xffffffffffffff88);
        (this->currentBlock->globOptData).argOutCount =
             (this->currentBlock->globOptData).argOutCount + 1;
      }
      bVar7 = StackSym::IsArgSlotSym(local_70);
      if (!bVar7) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar21 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar21 = 1;
        bVar7 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptBailOut.cpp"
                           ,0x234,"(stackSym->IsArgSlotSym())","stackSym->IsArgSlotSym()");
        if (!bVar7) {
          pcVar4 = (code *)invalidInstructionException();
          (*pcVar4)();
        }
        puVar21 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar21 = 0;
      }
      if ((*(uint *)&local_70->field_0x18 >> 0xe & 1) != 0) {
        pOVar18 = IR::Instr::GetDst(local_18);
        IVar5 = IR::Opnd::GetType(pOVar18);
        local_12c = TySize[IVar5];
        if (local_12c < 8) {
          local_12c = 8;
        }
        (this->currentBlock->globOptData).inlinedArgOutSize =
             local_12c + (this->currentBlock->globOptData).inlinedArgOutSize;
        bVar7 = IsLoopPrePass(this);
        if ((!bVar7) && (-1 < local_70->m_offset)) {
          StackSym::FixupStackOffset(local_70,local_18->m_func);
        }
      }
    }
    else {
      bVar7 = IR::Opnd::IsRegOpnd((Opnd *)stackSym);
      if (!bVar7) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar21 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar21 = 1;
        bVar7 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptBailOut.cpp"
                           ,0x245,"(opnd->IsRegOpnd())","opnd->IsRegOpnd()");
        if (!bVar7) {
          pcVar4 = (code *)invalidInstructionException();
          (*pcVar4)();
        }
        puVar21 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar21 = 0;
      }
      *(uint *)&this->field_0xf4 = *(uint *)&this->field_0xf4 & 0xfffffffe | 1;
    }
    if ((local_18->m_opcode == ArgOut_A_FixupForStackArgs) && (bVar7 = IsLoopPrePass(this), !bVar7))
    {
      local_18->m_opcode = ArgOut_A_Inline;
    }
  }
  else {
    if (OVar1 != IsInst) {
      if (((ushort)(OVar1 - ArgOut_A_Inline) < 2) || ((ushort)(OVar1 - ArgOut_A_Dynamic) < 4))
      goto LAB_005e6980;
      if (OVar1 != CallHelper) {
        if (OVar1 == BytecodeArgOutCapture) {
          pSVar13 = (this->currentBlock->globOptData).callSequence;
          pJVar12 = this->alloc;
          opnd = IR::Instr::GetDst(instr);
          SListBase<IR::Opnd_*,_Memory::ArenaAllocator,_RealCount>::Prepend
                    (pSVar13,&pJVar12->super_ArenaAllocator,&opnd);
          (this->currentBlock->globOptData).argOutCount =
               (this->currentBlock->globOptData).argOutCount + 1;
          return;
        }
        if (OVar1 == EndCallForPolymorphicInlinee) {
          EndTrackCall(this,instr);
          return;
        }
        if (OVar1 == InlineeStart) {
          pFVar20 = Func::GetParentFunc(instr->m_func);
          if (pFVar20 != (this->currentBlock->globOptData).curFunc) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            puVar21 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar21 = 1;
            bVar7 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptBailOut.cpp"
                               ,0x252,
                               "(instr->m_func->GetParentFunc() == this->currentBlock->globOptData.curFunc)"
                               ,
                               "instr->m_func->GetParentFunc() == this->currentBlock->globOptData.curFunc"
                              );
            if (!bVar7) {
              pcVar4 = (code *)invalidInstructionException();
              (*pcVar4)();
            }
            puVar21 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar21 = 0;
          }
          pFVar20 = Func::GetParentFunc(local_18->m_func);
          if (pFVar20 == (Func *)0x0) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            puVar21 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar21 = 1;
            bVar7 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptBailOut.cpp"
                               ,0x253,"(instr->m_func->GetParentFunc())",
                               "instr->m_func->GetParentFunc()");
            if (!bVar7) {
              pcVar4 = (code *)invalidInstructionException();
              (*pcVar4)();
            }
            puVar21 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar21 = 0;
          }
          (this->currentBlock->globOptData).curFunc = local_18->m_func;
          Func::UpdateMaxInlineeArgOutSize
                    (this->func,(this->currentBlock->globOptData).inlinedArgOutSize);
          EndTrackCall(this,local_18);
          pIVar14 = InlineeFrameInfo::New(local_18->m_func->m_alloc);
          pOVar18 = IR::Instr::GetSrc1(local_18);
          pSVar15 = IR::Opnd::GetSym(pOVar18);
          if (pSVar15 == (Sym *)0x0) {
            local_138 = (Value *)0x0;
          }
          else {
            pGVar16 = CurrentBlockData(this);
            pOVar18 = IR::Instr::GetSrc1(local_18);
            pSVar15 = IR::Opnd::GetSym(pOVar18);
            local_138 = GlobOptBlockData::FindValue(pGVar16,pSVar15);
          }
          pIVar14->functionSymStartValue = local_138;
          pGVar16 = CurrentBlockData(this);
          pBVar17 = BVSparse<Memory::JitArenaAllocator>::CopyNew
                              (pGVar16->liveFloat64Syms,this->alloc);
          pIVar14->floatSyms = pBVar17;
          pGVar16 = CurrentBlockData(this);
          pBVar17 = pGVar16->liveInt32Syms;
          pGVar16 = CurrentBlockData(this);
          pBVar17 = BVSparse<Memory::JitArenaAllocator>::MinusNew
                              (pBVar17,pGVar16->liveLossyInt32Syms,this->alloc);
          pIVar14->intSyms = pBVar17;
          pGVar16 = CurrentBlockData(this);
          pBVar17 = BVSparse<Memory::JitArenaAllocator>::CopyNew(pGVar16->liveVarSyms,this->alloc);
          pIVar14->varSyms = pBVar17;
          bVar7 = DoInlineArgsOpt(local_18->m_func);
          if (!bVar7) {
            local_18->m_func->cachedInlineeFrameInfo = pIVar14;
            return;
          }
          *(uint *)&local_18->m_func->field_0x240 =
               *(uint *)&local_18->m_func->field_0x240 & 0xfffffffd | 2;
          local_18->m_func->frameInfo = pIVar14;
          return;
        }
        if (OVar1 == InlineeEnd) {
          ProcessInlineeEnd(this,instr);
          return;
        }
        if (OVar1 == InlineeMetaArg) {
          pOVar18 = IR::Instr::GetDst(instr);
          bVar7 = IR::Opnd::IsSymOpnd(pOVar18);
          if (!bVar7) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            puVar21 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar21 = 1;
            bVar7 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptBailOut.cpp"
                               ,0x27d,"(instr->GetDst()->IsSymOpnd())",
                               "instr->GetDst()->IsSymOpnd()");
            if (!bVar7) {
              pcVar4 = (code *)invalidInstructionException();
              (*pcVar4)();
            }
            puVar21 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar21 = 0;
          }
          pOVar18 = IR::Instr::GetDst(local_18);
          pSVar19 = IR::Opnd::AsSymOpnd(pOVar18);
          this_01 = Sym::AsStackSym(pSVar19->m_sym);
          bVar7 = StackSym::IsArgSlotSym(this_01);
          if (!bVar7) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            puVar21 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar21 = 1;
            bVar7 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptBailOut.cpp"
                               ,0x27f,"(stackSym->IsArgSlotSym())","stackSym->IsArgSlotSym()");
            if (!bVar7) {
              pcVar4 = (code *)invalidInstructionException();
              (*pcVar4)();
            }
            puVar21 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar21 = 0;
          }
          bVar7 = IsLoopPrePass(this);
          if (!bVar7) {
            pFVar20 = Func::GetParentFunc(local_18->m_func);
            StackSym::FixupStackOffset(this_01,pFVar20);
          }
          (this->currentBlock->globOptData).inlinedArgOutSize =
               (this->currentBlock->globOptData).inlinedArgOutSize + 8;
          return;
        }
        if (OVar1 == InlineBuiltInStart) {
          *(uint *)&this->field_0xf4 = *(uint *)&this->field_0xf4 & 0xffffffef | 0x10;
          return;
        }
        if (1 < (ushort)(OVar1 - InlineBuiltInEnd)) {
          if (OVar1 == InlineArrayPop) {
            EndTrackCall(this,instr);
            return;
          }
          bVar7 = OpCodeAttr::CallInstr(instr->m_opcode);
          if (!bVar7) {
            return;
          }
          EndTrackCall(this,local_18);
          if ((*(uint *)&this->field_0xf4 >> 4 & 1) == 0) {
            return;
          }
          if ((((local_18->m_opcode != CallDirect) && (local_18->m_opcode != CallI)) &&
              (local_18->m_opcode != CallIDynamic)) && (local_18->m_opcode != CallIFixed)) {
            return;
          }
          EndTrackCall(this,local_18);
          return;
        }
        for (byteCodeUsesInstr = instr->m_prev; byteCodeUsesInstr->m_opcode != InlineBuiltInStart;
            byteCodeUsesInstr = byteCodeUsesInstr->m_prev) {
        }
        insertBeforeInstr = byteCodeUsesInstr->m_prev;
        insertByteCodeUsesAfterInstr = instr->m_prev;
        tmpInstr = insertByteCodeUsesAfterInstr;
        for (; insertByteCodeUsesAfterInstr->m_opcode != InlineBuiltInStart;
            insertByteCodeUsesAfterInstr = insertByteCodeUsesAfterInstr->m_prev) {
          if (insertByteCodeUsesAfterInstr->m_opcode == ByteCodeUses) {
            tmpInstr = insertByteCodeUsesAfterInstr;
          }
        }
        IR::Instr::Unlink(byteCodeUsesInstr);
        if (tmpInstr == local_18->m_prev) {
          IR::Instr::InsertBefore(tmpInstr,byteCodeUsesInstr);
        }
        else {
          IR::Instr::InsertBefore(tmpInstr->m_prev,byteCodeUsesInstr);
        }
        this_00 = byteCodeUsesInstr->m_prev;
        if (insertBeforeInstr != this_00) {
          while( true ) {
            bVar6 = IR::Instr::IsByteCodeUsesInstr(insertBeforeInstr);
            bVar7 = false;
            if (bVar6) {
              this_02 = IR::Instr::AsByteCodeUsesInstr(insertBeforeInstr);
              uVar8 = IR::Instr::GetByteCodeOffset(&this_02->super_Instr);
              uVar9 = IR::Instr::GetByteCodeOffset(byteCodeUsesInstr);
              bVar7 = uVar8 == uVar9;
            }
            if (!bVar7) break;
            pIVar3 = insertBeforeInstr->m_prev;
            IR::Instr::Unlink(insertBeforeInstr);
            IR::Instr::InsertAfter(this_00,insertBeforeInstr);
            insertBeforeInstr = pIVar3;
          }
        }
        if (local_18->m_opcode == InlineBuiltInEnd) {
          EndTrackCall(this,local_18);
        }
        uVar2 = (this->currentBlock->globOptData).inlinedArgOutSize;
        uVar10 = IR::Instr::GetArgOutSize(local_18,false);
        if (uVar2 < uVar10) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar21 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar21 = 1;
          bVar7 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptBailOut.cpp"
                             ,0x2d2,
                             "(this->currentBlock->globOptData.inlinedArgOutSize >= instr->GetArgOutSize( false))"
                             ,
                             "this->currentBlock->globOptData.inlinedArgOutSize >= instr->GetArgOutSize( false)"
                            );
          if (!bVar7) {
            pcVar4 = (code *)invalidInstructionException();
            (*pcVar4)();
          }
          puVar21 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar21 = 0;
        }
        uVar10 = IR::Instr::GetArgOutSize(local_18,false);
        (this->currentBlock->globOptData).inlinedArgOutSize =
             (this->currentBlock->globOptData).inlinedArgOutSize - uVar10;
        *(uint *)&this->field_0xf4 = *(uint *)&this->field_0xf4 & 0xffffffef;
        return;
      }
    }
    if ((*(uint *)&this->field_0xf4 & 1) == 0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar21 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar21 = 1;
      bVar7 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptBailOut.cpp"
                         ,0x273,"(this->isCallHelper)","this->isCallHelper");
      if (!bVar7) {
        pcVar4 = (code *)invalidInstructionException();
        (*pcVar4)();
      }
      puVar21 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar21 = 0;
    }
    *(uint *)&this->field_0xf4 = *(uint *)&this->field_0xf4 & 0xfffffffe;
  }
  return;
}

Assistant:

void
GlobOpt::TrackCalls(IR::Instr * instr)
{
    // Keep track of out params for bailout
    switch (instr->m_opcode)
    {
    case Js::OpCode::StartCall:
        Assert(!this->isCallHelper);
        Assert(instr->GetDst()->IsRegOpnd());
        Assert(instr->GetDst()->AsRegOpnd()->m_sym->m_isSingleDef);

        if (this->currentBlock->globOptData.callSequence == nullptr)
        {
            this->currentBlock->globOptData.callSequence = JitAnew(this->alloc, SListBase<IR::Opnd *>);
        }
        this->currentBlock->globOptData.callSequence->Prepend(this->alloc, instr->GetDst());

        this->currentBlock->globOptData.totalOutParamCount += instr->GetArgOutCount(/*getInterpreterArgOutCount*/ true);
        this->currentBlock->globOptData.startCallCount++;

        break;
    case Js::OpCode::BytecodeArgOutCapture:
        {
            this->currentBlock->globOptData.callSequence->Prepend(this->alloc, instr->GetDst());
            this->currentBlock->globOptData.argOutCount++;
            break;
        }
    case Js::OpCode::ArgOut_A:
    case Js::OpCode::ArgOut_A_Inline:
    case Js::OpCode::ArgOut_A_FixupForStackArgs:
    case Js::OpCode::ArgOut_A_InlineBuiltIn:
    case Js::OpCode::ArgOut_A_Dynamic:
    case Js::OpCode::ArgOut_A_FromStackArgs:
    case Js::OpCode::ArgOut_A_SpreadArg:
    {
        IR::Opnd * opnd = instr->GetDst();
        if (opnd->IsSymOpnd())
        {
            Assert(!this->isCallHelper);
            Assert(!this->currentBlock->globOptData.callSequence->Empty());
            StackSym* stackSym = opnd->AsSymOpnd()->m_sym->AsStackSym();

            // These scenarios are already tracked using BytecodeArgOutCapture,
            // and we don't want to be tracking ArgOut_A_FixupForStackArgs as these are only visible to the JIT and we should not be restoring them upon bailout.
            if (!stackSym->m_isArgCaptured && instr->m_opcode != Js::OpCode::ArgOut_A_FixupForStackArgs)
            {
                this->currentBlock->globOptData.callSequence->Prepend(this->alloc, instr->GetDst());
                this->currentBlock->globOptData.argOutCount++;
            }
            Assert(stackSym->IsArgSlotSym());
            if (stackSym->m_isInlinedArgSlot)
            {
                uint size = TySize[instr->GetDst()->GetType()];
                this->currentBlock->globOptData.inlinedArgOutSize += size < MachPtr ? MachPtr : size;
                // We want to update the offsets only once: don't do in prepass.
                if (!this->IsLoopPrePass() && stackSym->m_offset >= 0)
                {
                    Func * currentFunc = instr->m_func;
                    stackSym->FixupStackOffset(currentFunc);
                }
            }
        }
        else
        {
            // It is a reg opnd if it is a helper call
            // It should be all ArgOut until the CallHelper instruction
            Assert(opnd->IsRegOpnd());
            this->isCallHelper = true;
        }

        if (instr->m_opcode == Js::OpCode::ArgOut_A_FixupForStackArgs && !this->IsLoopPrePass())
        {
            instr->m_opcode = Js::OpCode::ArgOut_A_Inline;
        }
        break;
    }

    case Js::OpCode::InlineeStart:
    {
        Assert(instr->m_func->GetParentFunc() == this->currentBlock->globOptData.curFunc);
        Assert(instr->m_func->GetParentFunc());
        this->currentBlock->globOptData.curFunc = instr->m_func;

        this->func->UpdateMaxInlineeArgOutSize(this->currentBlock->globOptData.inlinedArgOutSize);
        this->EndTrackCall(instr);

        InlineeFrameInfo* inlineeFrameInfo = InlineeFrameInfo::New(instr->m_func->m_alloc);
        inlineeFrameInfo->functionSymStartValue = instr->GetSrc1()->GetSym() ?
            CurrentBlockData()->FindValue(instr->GetSrc1()->GetSym()) : nullptr;
        inlineeFrameInfo->floatSyms = CurrentBlockData()->liveFloat64Syms->CopyNew(this->alloc);
        inlineeFrameInfo->intSyms = CurrentBlockData()->liveInt32Syms->MinusNew(CurrentBlockData()->liveLossyInt32Syms, this->alloc);
        inlineeFrameInfo->varSyms = CurrentBlockData()->liveVarSyms->CopyNew(this->alloc);

        if (DoInlineArgsOpt(instr->m_func))
        {
            instr->m_func->m_hasInlineArgsOpt = true;
            instr->m_func->frameInfo = inlineeFrameInfo;
        }
        else
        {
            instr->m_func->cachedInlineeFrameInfo = inlineeFrameInfo;
        }
        break;
    }

    case Js::OpCode::EndCallForPolymorphicInlinee:
        // Have this opcode mimic the functions of both InlineeStart and InlineeEnd in the bailout block of a polymorphic call inlined using fixed methods.
        this->EndTrackCall(instr);
        break;

    case Js::OpCode::CallHelper:
    case Js::OpCode::IsInst:
        Assert(this->isCallHelper);
        this->isCallHelper = false;
        break;

    case Js::OpCode::InlineeEnd:
        ProcessInlineeEnd(instr);
        break;

    case Js::OpCode::InlineeMetaArg:
    {
        Assert(instr->GetDst()->IsSymOpnd());
        StackSym * stackSym = instr->GetDst()->AsSymOpnd()->m_sym->AsStackSym();
        Assert(stackSym->IsArgSlotSym());

        // InlineeMetaArg has the m_func set as the "inlinee" and not the "inliner"
        // TODO: Review this and fix the m_func of InlineeMetaArg to be "inliner" (as for the rest of the ArgOut's)
        // We want to update the offsets only once: don't do in prepass.
        if (!this->IsLoopPrePass())
        {
            Func * currentFunc = instr->m_func->GetParentFunc();
            stackSym->FixupStackOffset(currentFunc);
        }
        this->currentBlock->globOptData.inlinedArgOutSize += MachPtr;
        break;
    }

    case Js::OpCode::InlineBuiltInStart:
        this->inInlinedBuiltIn = true;
        break;

    case Js::OpCode::InlineNonTrackingBuiltInEnd:
    case Js::OpCode::InlineBuiltInEnd:
    {
        // If extra bailouts were added for the InlineMathXXX call itself,
        // move InlineeBuiltInStart just above the InlineMathXXX.
        // This is needed so that the function argument has lifetime after all bailouts for InlineMathXXX,
        // otherwise when we bailout we would get wrong function.
        IR::Instr* inlineBuiltInStartInstr = instr->m_prev;
        while (inlineBuiltInStartInstr->m_opcode != Js::OpCode::InlineBuiltInStart)
        {
            inlineBuiltInStartInstr = inlineBuiltInStartInstr->m_prev;
        }

        IR::Instr *byteCodeUsesInstr = inlineBuiltInStartInstr->m_prev;
        IR::Instr * insertBeforeInstr = instr->m_prev;
        IR::Instr * tmpInstr = insertBeforeInstr;
        while(tmpInstr->m_opcode != Js::OpCode::InlineBuiltInStart )
        {
            if(tmpInstr->m_opcode == Js::OpCode::ByteCodeUses)
            {
                insertBeforeInstr = tmpInstr;
            }
            tmpInstr = tmpInstr->m_prev;
        }
        inlineBuiltInStartInstr->Unlink();
        if(insertBeforeInstr == instr->m_prev)
        {
            insertBeforeInstr->InsertBefore(inlineBuiltInStartInstr);
        }

        else
        {
            insertBeforeInstr->m_prev->InsertBefore(inlineBuiltInStartInstr);
        }

        // Need to move the byte code uses instructions associated with inline built-in start instruction as well. For instance,
        // copy-prop may have replaced the function sym and inserted a byte code uses for the original sym holding the function.
        // That byte code uses instruction needs to appear after bailouts inserted for the InlinMathXXX instruction since the
        // byte code register holding the function object needs to be restored on bailout.
        IR::Instr *const insertByteCodeUsesAfterInstr = inlineBuiltInStartInstr->m_prev;
        if(byteCodeUsesInstr != insertByteCodeUsesAfterInstr)
        {
            // The InlineBuiltInStart instruction was moved, look for its ByteCodeUses instructions that also need to be moved
            while(
                byteCodeUsesInstr->IsByteCodeUsesInstr() &&
                byteCodeUsesInstr->AsByteCodeUsesInstr()->GetByteCodeOffset() == inlineBuiltInStartInstr->GetByteCodeOffset())
            {
                IR::Instr *const instrToMove = byteCodeUsesInstr;
                byteCodeUsesInstr = byteCodeUsesInstr->m_prev;
                instrToMove->Unlink();
                insertByteCodeUsesAfterInstr->InsertAfter(instrToMove);
            }
        }

        // The following code makes more sense to be processed when we hit InlineeBuiltInStart,
        // but when extra bailouts are added for the InlineMathXXX and InlineArrayPop instructions itself, those bailouts
        // need to know about current bailout record, but since they are added after TrackCalls is called
        // for InlineeBuiltInStart, we can't clear current record when got InlineeBuiltInStart

        // Do not track calls for InlineNonTrackingBuiltInEnd, as it is already tracked for InlineArrayPop
        if(instr->m_opcode == Js::OpCode::InlineBuiltInEnd)
        {
            this->EndTrackCall(instr);
        }

        Assert(this->currentBlock->globOptData.inlinedArgOutSize >= instr->GetArgOutSize(/*getInterpreterArgOutCount*/ false));
        this->currentBlock->globOptData.inlinedArgOutSize -= instr->GetArgOutSize(/*getInterpreterArgOutCount*/ false);

        this->inInlinedBuiltIn = false;
        break;
    }

    case Js::OpCode::InlineArrayPop:
    {
        // EndTrackCall should be called here as the Post-op BailOutOnImplicitCalls will bail out to the instruction after the Pop function call instr.
        // This bailout shouldn't be tracking the call sequence as it will then erroneously reserve stack space for arguments when the call would have already happened
        // Can't wait till InlineBuiltinEnd like we do for other InlineMathXXX because by then we would have filled bailout info for the BailOutOnImplicitCalls for InlineArrayPop.
        this->EndTrackCall(instr);
        break;
    }

    default:
        if (OpCodeAttr::CallInstr(instr->m_opcode))
        {
            this->EndTrackCall(instr);
            // With `InlineeBuiltInStart` and `InlineeBuiltInEnd` surrounding CallI/CallIDirect/CallIDynamic/CallIFixed,
            // we are not popping the call sequence correctly. That makes the bailout code thinks that we need to restore
            // argouts of the remaining call even though we shouldn't.
            // Also see Inline::InlineApplyWithArgumentsObject,  Inline::InlineApplyWithoutArrayArgument, Inline::InlineCall
            // in which we set the end tag instruction's opcode to InlineNonTrackingBuiltInEnd
            if (this->inInlinedBuiltIn &&
                (instr->m_opcode == Js::OpCode::CallDirect || instr->m_opcode == Js::OpCode::CallI ||
                 instr->m_opcode == Js::OpCode::CallIDynamic || instr->m_opcode == Js::OpCode::CallIFixed))
            {
                // We can end up in this situation when a built-in apply target is inlined to a CallDirect. We have the following IR:
                //
                // StartCall
                // ArgOut_InlineBuiltIn
                // ArgOut_InlineBuiltIn
                // ArgOut_InlineBuiltIn
                // InlineBuiltInStart
                //      ArgOut_A_InlineSpecialized
                //      ArgOut_A
                //      ArgOut_A
                //      CallDirect
                // InlineNonTrackingBuiltInEnd
                //
                // We need to call EndTrackCall twice for CallDirect in this case. The CallDirect may get a BailOutOnImplicitCalls later,
                // but it should not be tracking the call sequence for the apply call as it is a post op bailout and the call would have
                // happened when we bail out.
                // Can't wait till InlineBuiltinEnd like we do for other InlineMathXXX because by then we would have filled bailout info for the BailOutOnImplicitCalls for CallDirect.
                this->EndTrackCall(instr);
            }
        }
        break;
    }
}